

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS
ref_smooth_add_pliant_force
          (REF_NODE ref_node,REF_INT center,REF_INT neighbor,REF_DBL *total_force_vector)

{
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  REF_DBL ratio;
  REF_DBL norm [3];
  double local_40;
  double local_38 [4];
  double local_18;
  
  pRVar1 = ref_node->real;
  lVar3 = 0;
  do {
    local_38[lVar3] = pRVar1[center * 0xf + lVar3] - pRVar1[neighbor * 0xf + lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  uVar2 = ref_node_ratio(ref_node,center,neighbor,&local_40);
  if (uVar2 == 0) {
    dVar4 = local_40 * 1e+20;
    if (dVar4 <= -dVar4) {
      dVar4 = -dVar4;
    }
    if (local_38[0] <= -local_38[0]) {
      local_38[0] = -local_38[0];
    }
    uVar2 = 4;
    if (local_38[0] < dVar4) {
      if (local_38[1] <= -local_38[1]) {
        local_38[1] = -local_38[1];
      }
      if (local_38[1] < dVar4) {
        if (local_38[2] <= -local_38[2]) {
          local_38[2] = -local_38[2];
        }
        if (local_38[2] < dVar4) {
          lVar3 = 0;
          do {
            local_38[lVar3] = local_38[lVar3] / local_40;
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          dVar4 = local_40 * local_40 * local_40 * local_40;
          local_18 = 1.0 - dVar4;
          dVar4 = exp(-dVar4);
          uVar2 = 0;
          lVar3 = 0;
          do {
            total_force_vector[lVar3] =
                 local_38[lVar3] *
                 (double)(-(ulong)(local_40 < 1.0) &
                          (ulong)((1.0 - local_40) * (1.0 - local_40) + dVar4 * local_18) |
                         ~-(ulong)(local_40 < 1.0) & (ulong)(dVar4 * local_18)) +
                 total_force_vector[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x2e,
           "ref_smooth_add_pliant_force",(ulong)uVar2,"get r0");
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_add_pliant_force(
    REF_NODE ref_node, REF_INT center, REF_INT neighbor,
    REF_DBL *total_force_vector) {
  REF_INT ixyz;
  REF_DBL norm[3], force, l4, ratio;
  for (ixyz = 0; ixyz < 3; ixyz++)
    norm[ixyz] = ref_node_xyz(ref_node, ixyz, center) -
                 ref_node_xyz(ref_node, ixyz, neighbor);
  RSS(ref_node_ratio(ref_node, center, neighbor, &ratio), "get r0");
  if (ref_math_divisible(norm[0], ratio) &&
      ref_math_divisible(norm[1], ratio) &&
      ref_math_divisible(norm[2], ratio)) {
    for (ixyz = 0; ixyz < 3; ixyz++) norm[ixyz] /= ratio;
  } else {
    return REF_DIV_ZERO;
  }
  l4 = ratio * ratio * ratio * ratio;
  force = (1.0 - l4) * exp(-l4);
  if (ratio < 1.0) force += (1.0 - ratio) * (1.0 - ratio);
  for (ixyz = 0; ixyz < 3; ixyz++)
    total_force_vector[ixyz] += force * norm[ixyz];

  /*              --->
   *              ^
   *              |
   *              |  /
   *              | /
   *              |/
   *     <--------+---------->
   *              |
   *  &(d[3]) is the minor axis (flipped to direction)
   *  direction is normalized from center to neighbor
   *  torque is direction - minor axis with axis removed
   *  torque_ratio is 1 + len(torque)
   *  torque_norm is d[0]*norm(torque) / torque_ratio
   *  torque_force is f(torque_ratio)
   *  [ also try replusive instead of attractive? ]
   */

  /*
  {
    REF_DBL mlog0[6], mlog1[6];
    REF_DBL mlog[6], m[6], d[12];
    REF_DBL direction[3];
    REF_INT im;
    REF_DBL w0, w1;
    REF_DBL ar, torque[3], dot, len;
    for (ixyz = 0; ixyz < 3; ixyz++)
      direction[ixyz] = ref_node_xyz(ref_node, ixyz, center) -
                        ref_node_xyz(ref_node, ixyz, neighbor);
    RSS(ref_math_normalize(direction), "norm direction");
    RSS(ref_node_metric_get_log(ref_node, center, mlog0), "node0 m");
    RSS(ref_node_metric_get_log(ref_node, neighbor, mlog1), "node1 m");

    w1 = 0.5;
    w0 = 0.5;
    for (im = 0; im < 6; im++) {
      mlog[im] = w0 * mlog0[im] + w1 * mlog1[im];
    }
    RSS(ref_matrix_exp_m(mlog, m), "exp");
    RSS(ref_matrix_diag_m(m, d), "diag");
    RSS(ref_matrix_ascending_eig_twod(m), "order");
    ar = sqrt(d[0] / d[2]);
    if (0.0 > ref_math_dot(direction, &(d[3]))) {
      for (ixyz = 0; ixyz < 3; ixyz++) d[3 + ixyz] = -d[3 + ixyz];
    }
    for (ixyz = 0; ixyz < 3; ixyz++)
      torque[ixyz] = direction[ixyz] - d[3 + ixyz];
    dot = ref_math_dot(&(d[3]), torque);
    for (ixyz = 0; ixyz < 3; ixyz++) torque[ixyz] -= dot * d[3 + ixyz];
    len = sqrt(ref_math_dot(torque, torque));
    if (ar > 2.0 && ABS(len) < 0.5) {
      ratio = 1.0 + len;
      RSS(ref_math_normalize(torque), "norm torque");
      for (ixyz = 0; ixyz < 3; ixyz++) torque[ixyz] *= d[0]/ratio;
      l4 = ratio * ratio * ratio * ratio;
      force = (1.0 - l4) * exp(-l4);
      for (ixyz = 0; ixyz < 3; ixyz++)
        total_force_vector[ixyz] -= torque[ixyz] * len;
    }
  }
  */

  return REF_SUCCESS;
}